

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O3

OpenMPClause *
OpenMPLastprivateClause::addLastprivateClause
          (OpenMPDirective *directive,OpenMPLastprivateClauseModifier modifier)

{
  iterator __position;
  mapped_type *ppvVar1;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *pvVar2;
  OpenMPClause **ppOVar3;
  OpenMPClause *local_30;
  key_type local_24;
  
  local_30 = (OpenMPClause *)CONCAT44(local_30._4_4_,0xd);
  ppvVar1 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](&directive->clauses,(key_type *)&local_30);
  pvVar2 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)*ppvVar1;
  ppOVar3 = *(OpenMPClause ***)pvVar2;
  __position._M_current = *(OpenMPClause ***)(pvVar2 + 8);
  if (__position._M_current == ppOVar3) {
    local_30 = (OpenMPClause *)operator_new(0x70);
    (local_30->super_SourceLocation).line = 0;
    (local_30->super_SourceLocation).column = 0;
    (local_30->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
    local_30->kind = OMPC_lastprivate;
    local_30->clause_position = -1;
    (local_30->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_30->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_30->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_30->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__001b93f0;
    *(OpenMPLastprivateClauseModifier *)&local_30[1]._vptr_OpenMPClause = modifier;
    pvVar2 = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
    *(undefined8 *)pvVar2 = 0;
    *(undefined8 *)(pvVar2 + 8) = 0;
    *(undefined8 *)(pvVar2 + 0x10) = 0;
    std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::_M_realloc_insert<OpenMPClause*const&>
              (pvVar2,(iterator)0x0,&local_30);
    local_24 = OMPC_lastprivate;
    ppvVar1 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,&local_24);
    *ppvVar1 = (mapped_type)pvVar2;
  }
  else {
    do {
      if (*(OpenMPLastprivateClauseModifier *)&(*ppOVar3)[1]._vptr_OpenMPClause == modifier) {
        return *ppOVar3;
      }
      ppOVar3 = ppOVar3 + 1;
    } while (ppOVar3 != __position._M_current);
    local_30 = (OpenMPClause *)operator_new(0x70);
    (local_30->super_SourceLocation).line = 0;
    (local_30->super_SourceLocation).column = 0;
    (local_30->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
    local_30->kind = OMPC_lastprivate;
    local_30->clause_position = -1;
    (local_30->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_30->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_30->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_30->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__001b93f0;
    *(OpenMPLastprivateClauseModifier *)&local_30[1]._vptr_OpenMPClause = modifier;
    if (__position._M_current == *(OpenMPClause ***)(pvVar2 + 0x10)) {
      std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
      _M_realloc_insert<OpenMPClause*const&>(pvVar2,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
    }
  }
  return local_30;
}

Assistant:

OpenMPClause* OpenMPLastprivateClause::addLastprivateClause(OpenMPDirective *directive, OpenMPLastprivateClauseModifier modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_lastprivate);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPLastprivateClause(modifier);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_lastprivate] = current_clauses;
        } else {
            for(std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {

                if (((OpenMPLastprivateClause*)(*it))->getModifier() == modifier) {
                    new_clause = (*it);
                    return new_clause;
                };
            };
            new_clause = new OpenMPLastprivateClause(modifier);
            current_clauses->push_back(new_clause);
        }
    return new_clause;
}